

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatSkill.cpp
# Opt level: O0

void Handlers::StatSkill_Open(Character *character,PacketReader *reader)

{
  bool bVar1;
  unsigned_short uVar2;
  vector<NPC_*,_std::allocator<NPC_*>_> *this;
  reference ppNVar3;
  NPC_Data *pNVar4;
  size_type sVar5;
  long lVar6;
  char *pcVar7;
  reference this_00;
  pointer pNVar8;
  unsigned_short *puVar9;
  unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *skill;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
  *__range3;
  string local_a0;
  undefined1 local_70 [8];
  PacketBuilder reply;
  NPC *npc;
  iterator __end1;
  iterator __begin1;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range1;
  short id;
  PacketReader *reader_local;
  Character *character_local;
  
  uVar2 = PacketReader::GetShort(reader);
  this = &character->map->npcs;
  __end1 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin(this);
  npc = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(this);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                                *)&npc);
    if (!bVar1) {
      return;
    }
    ppNVar3 = __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
              operator*(&__end1);
    reply.add_size = (size_t)*ppNVar3;
    if (((NPC *)reply.add_size)->index == uVar2) {
      pNVar4 = NPC::Data((NPC *)reply.add_size);
      sVar5 = std::
              vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
              ::size(&pNVar4->skill_learn);
      if (sVar5 != 0) {
        character->npc = (NPC *)reply.add_size;
        character->npc_type = Skills;
        NPC::Data((NPC *)reply.add_size);
        lVar6 = std::__cxx11::string::length();
        pNVar4 = NPC::Data((NPC *)reply.add_size);
        sVar5 = std::
                vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
                ::size(&pNVar4->skill_learn);
        PacketBuilder::PacketBuilder
                  ((PacketBuilder *)local_70,PACKET_STATSKILL,PACKET_OPEN,lVar6 + 2 + sVar5 * 0x1c);
        PacketBuilder::AddShort
                  ((PacketBuilder *)local_70,*(unsigned_short *)(reply.add_size + 0x68));
        NPC::Data((NPC *)reply.add_size);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_a0,pcVar7,(allocator *)((long)&__range3 + 7));
        PacketBuilder::AddBreakString((PacketBuilder *)local_70,&local_a0,0xff);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
        pNVar4 = NPC::Data((NPC *)reply.add_size);
        __end3 = std::
                 vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
                 ::begin(&pNVar4->skill_learn);
        skill = (unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                std::
                vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
                ::end(&pNVar4->skill_learn);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_*,_std::vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>_>
                                           *)&skill), bVar1) {
          this_00 = __gnu_cxx::
                    __normal_iterator<const_std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_*,_std::vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>_>
                    ::operator*(&__end3);
          pNVar8 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                   operator->(this_00);
          PacketBuilder::AddShort((PacketBuilder *)local_70,pNVar8->id);
          pNVar8 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                   operator->(this_00);
          PacketBuilder::AddChar((PacketBuilder *)local_70,pNVar8->levelreq);
          pNVar8 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                   operator->(this_00);
          PacketBuilder::AddChar((PacketBuilder *)local_70,pNVar8->classreq);
          pNVar8 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                   operator->(this_00);
          PacketBuilder::AddInt((PacketBuilder *)local_70,pNVar8->cost);
          pNVar8 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                   operator->(this_00);
          puVar9 = (unsigned_short *)std::array<short,_4UL>::operator[](&pNVar8->skillreq,0);
          PacketBuilder::AddShort((PacketBuilder *)local_70,*puVar9);
          pNVar8 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                   operator->(this_00);
          puVar9 = (unsigned_short *)std::array<short,_4UL>::operator[](&pNVar8->skillreq,1);
          PacketBuilder::AddShort((PacketBuilder *)local_70,*puVar9);
          pNVar8 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                   operator->(this_00);
          puVar9 = (unsigned_short *)std::array<short,_4UL>::operator[](&pNVar8->skillreq,2);
          PacketBuilder::AddShort((PacketBuilder *)local_70,*puVar9);
          pNVar8 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                   operator->(this_00);
          puVar9 = (unsigned_short *)std::array<short,_4UL>::operator[](&pNVar8->skillreq,3);
          PacketBuilder::AddShort((PacketBuilder *)local_70,*puVar9);
          pNVar8 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                   operator->(this_00);
          PacketBuilder::AddShort((PacketBuilder *)local_70,pNVar8->strreq);
          pNVar8 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                   operator->(this_00);
          PacketBuilder::AddShort((PacketBuilder *)local_70,pNVar8->wisreq);
          pNVar8 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                   operator->(this_00);
          PacketBuilder::AddShort((PacketBuilder *)local_70,pNVar8->intreq);
          pNVar8 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                   operator->(this_00);
          PacketBuilder::AddShort((PacketBuilder *)local_70,pNVar8->agireq);
          pNVar8 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                   operator->(this_00);
          PacketBuilder::AddShort((PacketBuilder *)local_70,pNVar8->conreq);
          pNVar8 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                   operator->(this_00);
          PacketBuilder::AddShort((PacketBuilder *)local_70,pNVar8->chareq);
          __gnu_cxx::
          __normal_iterator<const_std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_*,_std::vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>_>
          ::operator++(&__end3);
        }
        Character::Send(character,(PacketBuilder *)local_70);
        PacketBuilder::~PacketBuilder((PacketBuilder *)local_70);
        return;
      }
    }
    __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::operator++
              (&__end1);
  } while( true );
}

Assistant:

void StatSkill_Open(Character *character, PacketReader &reader)
	{
		short id = reader.GetShort();

		UTIL_FOREACH(character->map->npcs, npc)
		{
			if (npc->index == id && npc->Data().skill_learn.size() > 0)
			{
				character->npc = npc;
				character->npc_type = ENF::Skills;

				PacketBuilder reply(PACKET_STATSKILL, PACKET_OPEN, 2 + npc->Data().skill_name.length() + npc->Data().skill_learn.size() * 28);
				reply.AddShort(npc->id);
				reply.AddBreakString(npc->Data().skill_name.c_str());

				UTIL_FOREACH_CREF(npc->Data().skill_learn, skill)
				{
					reply.AddShort(skill->id);
					reply.AddChar(skill->levelreq);
					reply.AddChar(skill->classreq);
					reply.AddInt(skill->cost);
					reply.AddShort(skill->skillreq[0]);
					reply.AddShort(skill->skillreq[1]);
					reply.AddShort(skill->skillreq[2]);
					reply.AddShort(skill->skillreq[3]);
					reply.AddShort(skill->strreq);
					reply.AddShort(skill->wisreq);
					reply.AddShort(skill->intreq);
					reply.AddShort(skill->agireq);
					reply.AddShort(skill->conreq);
					reply.AddShort(skill->chareq);
				}

				character->Send(reply);

				break;
			}
		}
	}